

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputedValues.h
# Opt level: O0

void __thiscall Rml::Style::CommonValues::CommonValues(CommonValues *this)

{
  CommonValues *this_local;
  
  *(ulong *)this = *(ulong *)this & 0xfffffffffffffff0 | 2;
  *(ulong *)this = *(ulong *)this & 0xffffffffffffffcf;
  *(ulong *)this = *(ulong *)this & 0xffffffffffffff3f;
  *(ulong *)this = *(ulong *)this & 0xfffffffffffffcff;
  *(ulong *)this = *(ulong *)this & 0xfffffffffffff3ff;
  *(ulong *)this = *(ulong *)this & 0xffffffffffffcfff;
  *(ulong *)this = *(ulong *)this & 0xffffffffffffbfff;
  *(ulong *)this = *(ulong *)this & 0xffffffffffff7fff;
  *(ulong *)this = *(ulong *)this & 0xfffffffffffeffff;
  *(ulong *)this = *(ulong *)this & 0xfffffffffff9ffff;
  *(ulong *)this = *(ulong *)this & 0xffffffffffe7ffff;
  *(ulong *)this = *(ulong *)this & 0xffffffffff9fffff | 0x200000;
  *(ulong *)this = *(ulong *)this & 0xfffffffffcffffff | 0x1000000;
  *(ulong *)this = *(ulong *)this & 0xfffffffff3ffffff | 0x4000000;
  *(ulong *)this = *(ulong *)this & 0xffffffffcfffffff | 0x10000000;
  *(ulong *)this = *(ulong *)this & 0xffffffffbfffffff;
  *(ulong *)this = *(ulong *)this & 0xffffffff7fffffff;
  *(ulong *)this = *(ulong *)this & 0xfffffffeffffffff;
  *(ulong *)this = *(ulong *)this & 0xfffffffdffffffff;
  *(ulong *)this = *(ulong *)this & 0xfffffff3ffffffff;
  *(ulong *)this = *(ulong *)this & 0xffffffcfffffffff;
  *(ulong *)this = *(ulong *)this & 0xffffff3fffffffff;
  *(ulong *)this = *(ulong *)this & 0xfffffcffffffffff;
  *(ulong *)this = *(ulong *)this & 0xfffffbffffffffff;
  this->width_value = 0.0;
  this->height_value = 0.0;
  this->margin_top_value = 0.0;
  this->margin_right_value = 0.0;
  this->margin_bottom_value = 0.0;
  this->margin_left_value = 0.0;
  this->padding_top_value = 0.0;
  this->padding_right_value = 0.0;
  this->padding_bottom_value = 0.0;
  this->padding_left_value = 0.0;
  this->top_value = 0.0;
  this->right_value = 0.0;
  this->bottom_value = 0.0;
  this->left_value = 0.0;
  this->z_index_value = 0.0;
  this->border_top_width = 0;
  this->border_right_width = 0;
  this->border_bottom_width = 0;
  this->border_left_width = 0;
  Colour<unsigned_char,_255,_false>::Colour(&this->border_top_color,0xff,0xff,0xff,0xff);
  Colour<unsigned_char,_255,_false>::Colour(&this->border_right_color,0xff,0xff,0xff,0xff);
  Colour<unsigned_char,_255,_false>::Colour(&this->border_bottom_color,0xff,0xff,0xff,0xff);
  Colour<unsigned_char,_255,_false>::Colour(&this->border_left_color,0xff,0xff,0xff,0xff);
  Colour<unsigned_char,_255,_false>::Colour(&this->background_color,'\0','\0','\0','\0');
  return;
}

Assistant:

CommonValues() :
			display(Display::Inline), position(Position::Static), float_(Float::None), clear(Clear::None), overflow_x(Overflow::Visible),
			overflow_y(Overflow::Visible), visibility(Visibility::Visible),

			has_decorator(false), box_sizing(BoxSizing::ContentBox),

			width_type(LengthPercentageAuto::Auto), height_type(LengthPercentageAuto::Auto),

			margin_top_type(LengthPercentageAuto::Length), margin_right_type(LengthPercentageAuto::Length),
			margin_bottom_type(LengthPercentageAuto::Length), margin_left_type(LengthPercentageAuto::Length),

			padding_top_type(LengthPercentage::Length), padding_right_type(LengthPercentage::Length), padding_bottom_type(LengthPercentage::Length),
			padding_left_type(LengthPercentage::Length),

			top_type(LengthPercentageAuto::Auto), right_type(LengthPercentageAuto::Auto), bottom_type(LengthPercentageAuto::Auto),
			left_type(LengthPercentageAuto::Auto), z_index_type(NumberAuto::Auto)
		{}